

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix4 * matrix4_rotatev3(matrix4 *self,vector3 *axis,float angle)

{
  quaternion q;
  matrix4 rotationMatrix;
  quaternion qStack_68;
  matrix4 local_58;
  
  quaternion_set_from_axis_anglev3(&qStack_68,axis,angle);
  matrix4_make_transformation_rotationq(&local_58,&qStack_68);
  matrix4_multiply(self,&local_58);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_rotatev3(struct matrix4 *self, const struct vector3 *axis, HYP_FLOAT angle)
{
	struct matrix4 rotationMatrix;
	struct quaternion q;

	return matrix4_multiply(self,
				matrix4_make_transformation_rotationq(&rotationMatrix,
								      quaternion_set_from_axis_anglev3(&q, axis, angle)));
}